

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

ulong __thiscall cornerstone::buffer::get_ulong(buffer *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  overflow_error *this_00;
  uint uVar4;
  long lVar5;
  buffer *pbVar6;
  
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar2 = uVar1 & 0x7fffffff;
  }
  else {
    uVar2 = (uint)*(ushort *)this;
  }
  if ((int)uVar1 < 0) {
    uVar4 = *(uint *)(this + 4);
  }
  else {
    uVar4 = (uint)*(ushort *)(this + 2);
  }
  if (7 < (ulong)uVar2 - (ulong)uVar4) {
    if ((int)uVar1 < 0) {
      lVar5 = (ulong)*(uint *)(this + 4) + 8;
    }
    else {
      lVar5 = (ulong)*(ushort *)(this + 2) + 4;
    }
    pbVar6 = this + lVar5;
    lVar5 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + ((ulong)(byte)*pbVar6 << ((byte)lVar5 & 0x3f));
      lVar5 = lVar5 + 8;
      pbVar6 = pbVar6 + 1;
    } while (lVar5 != 0x40);
    if ((int)uVar1 < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 8;
    }
    else {
      *(short *)(this + 2) = *(short *)(this + 2) + 8;
    }
    return uVar3;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer available for an ulong value");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const
{
    return (size_t)(__size_of_block(this));
}